

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_2,_2> *
tcu::operator*(Matrix<double,_2,_2> *__return_storage_ptr__,Matrix<double,_2,_2> *mtx,double scalar)

{
  Matrix<double,_2,_2> *pMVar1;
  long lVar2;
  long lVar3;
  int row;
  double *pdVar4;
  Matrix<double,_2,_2> *res;
  long lVar5;
  bool bVar6;
  undefined8 uVar7;
  
  pMVar1 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      uVar7 = 0x3ff0000000000000;
      if (lVar2 != lVar5) {
        uVar7 = 0;
      }
      *(undefined8 *)((long)pdVar4 + lVar5) = uVar7;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 == 0x10);
    pdVar4 = pdVar4 + 1;
    lVar2 = lVar2 + 0x10;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      ((Vector<tcu::Vector<double,_2>,_2> *)((Vector<double,_2> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar2] =
           ((Vector<tcu::Vector<double,_2>,_2> *)((Vector<double,_2> *)mtx)->m_data)->m_data[0].
           m_data[lVar2] * scalar;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    __return_storage_ptr__ = (Matrix<double,_2,_2> *)((long)__return_storage_ptr__ + 0x10);
    mtx = (Matrix<double,_2,_2> *)((long)mtx + 0x10);
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  return pMVar1;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}